

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O3

void Hacl_Bignum256_32_sub_mod(uint32_t *n,uint32_t *a,uint32_t *b,uint32_t *res)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint32_t t1;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  
  uVar18 = *a;
  uVar1 = *b;
  uVar25 = uVar18 - *b;
  *res = uVar25;
  uVar21 = a[1];
  uVar13 = (uint)(uVar18 < uVar1);
  uVar18 = b[1];
  uVar15 = uVar21 - b[1];
  uVar20 = uVar15 - uVar13;
  res[1] = uVar20;
  uVar1 = a[2];
  uVar13 = (uint)(uVar21 < uVar18 || uVar15 < uVar13);
  uVar18 = b[2];
  uVar15 = uVar1 - b[2];
  uVar19 = uVar15 - uVar13;
  res[2] = uVar19;
  uVar21 = a[3];
  uVar13 = (uint)(uVar1 < uVar18 || uVar15 < uVar13);
  uVar18 = b[3];
  uVar15 = uVar21 - b[3];
  uVar24 = uVar15 - uVar13;
  res[3] = uVar24;
  uVar1 = a[4];
  uVar13 = (uint)(uVar21 < uVar18 || uVar15 < uVar13);
  uVar18 = b[4];
  uVar15 = uVar1 - b[4];
  uVar23 = uVar15 - uVar13;
  res[4] = uVar23;
  uVar21 = a[5];
  uVar13 = (uint)(uVar1 < uVar18 || uVar15 < uVar13);
  uVar18 = b[5];
  uVar15 = uVar21 - b[5];
  uVar22 = uVar15 - uVar13;
  res[5] = uVar22;
  uVar1 = a[6];
  uVar13 = (uint)(uVar21 < uVar18 || uVar15 < uVar13);
  uVar18 = b[6];
  uVar15 = uVar1 - b[6];
  uVar26 = uVar15 - uVar13;
  res[6] = uVar26;
  uVar21 = a[7];
  uVar14 = (uint)(uVar1 < uVar18 || uVar15 < uVar13);
  uVar18 = b[7];
  uVar16 = uVar21 - b[7];
  uVar17 = uVar16 - uVar14;
  res[7] = uVar17;
  uVar13 = (uint)CARRY4(*n,uVar25);
  uVar7 = n[1] + uVar20;
  uVar15 = (uint)(CARRY4(n[1],uVar20) || CARRY4(uVar7,uVar13));
  uVar8 = n[2] + uVar19;
  uVar3 = (uint)(CARRY4(n[2],uVar19) || CARRY4(uVar8,uVar15));
  uVar9 = n[3] + uVar24;
  uVar4 = (uint)(CARRY4(n[3],uVar24) || CARRY4(uVar9,uVar3));
  uVar10 = n[4] + uVar23;
  uVar5 = (uint)(CARRY4(n[4],uVar23) || CARRY4(uVar10,uVar4));
  uVar11 = n[5] + uVar22;
  uVar1 = n[6];
  uVar6 = (uint)(CARRY4(n[5],uVar22) || CARRY4(uVar11,uVar5));
  uVar12 = uVar1 + uVar26;
  uVar2 = n[7];
  uVar18 = (uint)(uVar21 < uVar18 || uVar16 < uVar14);
  uVar21 = -uVar18;
  uVar18 = uVar18 - 1;
  *res = uVar25 & uVar18 | *n + uVar25 & uVar21;
  res[1] = uVar20 & uVar18 | uVar7 + uVar13 & uVar21;
  res[2] = uVar19 & uVar18 | uVar8 + uVar15 & uVar21;
  res[3] = uVar24 & uVar18 | uVar9 + uVar3 & uVar21;
  res[4] = uVar23 & uVar18 | uVar10 + uVar4 & uVar21;
  res[5] = uVar22 & uVar18 | uVar11 + uVar5 & uVar21;
  res[6] = uVar26 & uVar18 | uVar12 + uVar6 & uVar21;
  res[7] = uVar18 & uVar17 |
           uVar21 & uVar2 + uVar17 + (uint)(CARRY4(uVar1,uVar26) || CARRY4(uVar12,uVar6));
  return;
}

Assistant:

void Hacl_Bignum256_32_sub_mod(uint32_t *n, uint32_t *a, uint32_t *b, uint32_t *res)
{
  uint32_t c0 = 0U;
  KRML_MAYBE_FOR2(i,
    0U,
    2U,
    1U,
    uint32_t t1 = a[4U * i];
    uint32_t t20 = b[4U * i];
    uint32_t *res_i0 = res + 4U * i;
    c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c0, t1, t20, res_i0);
    uint32_t t10 = a[4U * i + 1U];
    uint32_t t21 = b[4U * i + 1U];
    uint32_t *res_i1 = res + 4U * i + 1U;
    c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c0, t10, t21, res_i1);
    uint32_t t11 = a[4U * i + 2U];
    uint32_t t22 = b[4U * i + 2U];
    uint32_t *res_i2 = res + 4U * i + 2U;
    c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c0, t11, t22, res_i2);
    uint32_t t12 = a[4U * i + 3U];
    uint32_t t2 = b[4U * i + 3U];
    uint32_t *res_i = res + 4U * i + 3U;
    c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c0, t12, t2, res_i););
  uint32_t c00 = c0;
  uint32_t tmp[8U] = { 0U };
  uint32_t c = 0U;
  KRML_MAYBE_FOR2(i,
    0U,
    2U,
    1U,
    uint32_t t1 = res[4U * i];
    uint32_t t20 = n[4U * i];
    uint32_t *res_i0 = tmp + 4U * i;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t1, t20, res_i0);
    uint32_t t10 = res[4U * i + 1U];
    uint32_t t21 = n[4U * i + 1U];
    uint32_t *res_i1 = tmp + 4U * i + 1U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t10, t21, res_i1);
    uint32_t t11 = res[4U * i + 2U];
    uint32_t t22 = n[4U * i + 2U];
    uint32_t *res_i2 = tmp + 4U * i + 2U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t11, t22, res_i2);
    uint32_t t12 = res[4U * i + 3U];
    uint32_t t2 = n[4U * i + 3U];
    uint32_t *res_i = tmp + 4U * i + 3U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t12, t2, res_i););
  uint32_t c1 = c;
  KRML_MAYBE_UNUSED_VAR(c1);
  uint32_t c2 = 0U - c00;
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t *os = res;
    uint32_t x = (c2 & tmp[i]) | (~c2 & res[i]);
    os[i] = x;);
}